

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::Datum::InternalSerializeWithCachedSizesToArray(Datum *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  string *str;
  Rep *pRVar4;
  void *pvVar5;
  bool bVar6;
  byte *pbVar7;
  LogMessage *other;
  ulong uVar8;
  ulong uVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 2) != 0) {
    uVar8 = (ulong)this->channels_;
    pbVar7 = target + 1;
    *target = '\b';
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  if ((uVar2 & 4) != 0) {
    uVar8 = (ulong)this->height_;
    pbVar7 = target + 1;
    *target = 0x10;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  if ((uVar2 & 8) != 0) {
    uVar8 = (ulong)this->width_;
    pbVar7 = target + 1;
    *target = 0x18;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  if ((uVar2 & 1) != 0) {
    str = (this->data_).ptr_;
    *target = 0x22;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(str,target + 1);
  }
  if ((uVar2 & 0x10) != 0) {
    uVar8 = (ulong)this->label_;
    pbVar7 = target + 1;
    *target = 0x28;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  uVar3 = (this->float_data_).current_size_;
  if (uVar3 != 0) {
    if ((this->float_data_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar4 = (this->float_data_).rep_;
    uVar8 = 1;
    if (1 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar9 = 0;
    do {
      fVar1 = pRVar4->elements[uVar9];
      *target = 0x35;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if ((uVar2 & 0x20) != 0) {
    bVar6 = this->encoded_;
    *target = 0x38;
    target[1] = bVar6;
    target = target + 2;
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* Datum::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.Datum)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 channels = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->channels(), target);
  }

  // optional int32 height = 2;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->height(), target);
  }

  // optional int32 width = 3;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->width(), target);
  }

  // optional bytes data = 4;
  if (cached_has_bits & 0x00000001u) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        4, this->data(), target);
  }

  // optional int32 label = 5;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(5, this->label(), target);
  }

  // repeated float float_data = 6;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(6, this->float_data_, target);

  // optional bool encoded = 7 [default = false];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->encoded(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.Datum)
  return target;
}